

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::writeObject(QPDFWriter *this,QPDFObjectHandle *object,int object_stream_index)

{
  int objid;
  uint uVar1;
  element_type *peVar2;
  long lVar3;
  ulong __val;
  uint uVar4;
  uint uVar5;
  char cVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  Object *pOVar9;
  const_iterator cVar10;
  uint *puVar11;
  long *plVar12;
  uint uVar13;
  size_t __n;
  long *plVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  char cVar17;
  _Base_ptr p_Var18;
  ulong uVar19;
  uint uVar20;
  string __str;
  QPDFObjGen old_og;
  long *local_e0;
  void *local_d8;
  long local_d0;
  long lStack_c8;
  QPDFObjGen local_c0;
  int local_b4;
  QPDFObjectHandle *local_b0;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  QPDFObjGen local_38;
  
  local_c0 = QPDFObjectHandle::getObjGen(object);
  if ((object_stream_index == -1) && (local_c0.gen == 0)) {
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var8 = &(peVar2->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var15 = p_Var8;
    for (p_Var18 = *(_Base_ptr *)
                    ((long)&(peVar2->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header +
                    8); p_Var18 != (_Base_ptr)0x0;
        p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < local_c0.obj]) {
      if (local_c0.obj <= (int)p_Var18[1]._M_color) {
        p_Var15 = p_Var18;
      }
    }
    p_Var18 = p_Var8;
    if ((p_Var15 != p_Var8) && (p_Var18 = p_Var15, local_c0.obj < (int)p_Var15[1]._M_color)) {
      p_Var18 = p_Var8;
    }
    if (p_Var18 != p_Var8) {
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (object->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_88.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      writeObjectStream(this,&local_88);
      if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      return;
    }
  }
  indicateProgress(this,false,false);
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar19 = (ulong)local_c0.obj;
  lVar3 = *(long *)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                    super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    _M_impl;
  __n = (long)*(pointer *)
               ((long)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_> +
               8) - lVar3 >> 2;
  if (__n * -0x5555555555555555 < uVar19 || __n * -0x5555555555555555 - uVar19 == 0) {
    pOVar9 = ObjTable<QPDFWriter::Object>::large_element
                       (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,uVar19);
  }
  else {
    __n = uVar19 * 3;
    pOVar9 = (Object *)(lVar3 + uVar19 * 0xc);
  }
  objid = pOVar9->renumber;
  peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->qdf_mode == true) {
    cVar10 = std::
             _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::find(&(peVar2->page_object_to_seq)._M_t,&local_c0);
    local_b4 = object_stream_index;
    local_b0 = object;
    if (cVar10._M_node != &(peVar2->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header
       ) {
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27db15,(void *)0x8,__n);
      puVar11 = (uint *)std::
                        map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                        ::operator[](&((this->m).
                                       super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->page_object_to_seq,&local_c0);
      uVar1 = *puVar11;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar20 = 1;
      if (9 < uVar4) {
        __n = (size_t)uVar4;
        uVar5 = 4;
        do {
          uVar20 = uVar5;
          uVar13 = (uint)__n;
          if (uVar13 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_001f0c0f;
          }
          if (uVar13 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_001f0c0f;
          }
          if (uVar13 < 10000) goto LAB_001f0c0f;
          __n = __n / 10000;
          uVar5 = uVar20 + 4;
        } while (99999 < uVar13);
        uVar20 = uVar20 + 1;
      }
LAB_001f0c0f:
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar20 - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_e0 + (ulong)(uVar1 >> 0x1f)),uVar20,uVar4);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,__n);
      object_stream_index = local_b4;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27dc2d,(void *)0x1,__n);
    }
    object = local_b0;
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    cVar10 = std::
             _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::find(&(peVar2->contents_to_page_seq)._M_t,&local_c0);
    if (cVar10._M_node !=
        &(peVar2->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header) {
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27db1e,(void *)0x15,__n);
      puVar11 = (uint *)std::
                        map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                        ::operator[](&((this->m).
                                       super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->contents_to_page_seq,&local_c0);
      uVar1 = *puVar11;
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      uVar20 = 1;
      if (9 < uVar4) {
        __n = (size_t)uVar4;
        uVar5 = 4;
        do {
          uVar20 = uVar5;
          uVar13 = (uint)__n;
          if (uVar13 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_001f0d58;
          }
          if (uVar13 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_001f0d58;
          }
          if (uVar13 < 10000) goto LAB_001f0d58;
          __n = __n / 10000;
          uVar5 = uVar20 + 4;
        } while (99999 < uVar13);
        uVar20 = uVar20 + 1;
      }
LAB_001f0d58:
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar20 - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_e0 + (ulong)(uVar1 >> 0x1f)),uVar20,uVar4);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,__n);
      object_stream_index = local_b4;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27dc2d,(void *)0x1,__n);
      object = local_b0;
    }
  }
  if (object_stream_index == -1) {
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->qdf_mode == true) && (peVar2->suppress_original_object_ids == false)) {
      local_38 = QPDFObjectHandle::getObjGen(object);
      QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_38,' ');
      plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x27db34);
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_68 = *plVar14;
        lStack_60 = plVar12[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar14;
        local_78 = (long *)*plVar12;
      }
      local_70 = plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar14 = plVar12 + 2;
      if ((long *)*plVar12 == plVar14) {
        local_d0 = *plVar14;
        lStack_c8 = plVar12[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar14;
        local_e0 = (long *)*plVar12;
      }
      local_d8 = (void *)plVar12[1];
      *plVar12 = (long)plVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,(size_t)plVar14);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    openObject(this,objid);
    setDataKey(this,objid);
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    uVar19 = 0;
    unparseObject(this,&local_98,0,0,0,false);
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar2->cur_data_key)._M_string_length = 0;
    *(peVar2->cur_data_key)._M_dataplus._M_p = '\0';
    closeObject(this,objid);
  }
  else {
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    uVar19 = 4;
    unparseObject(this,&local_a8,0,4,0,false);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27dc2d,(void *)0x1,uVar19);
  }
  if ((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       direct_stream_lengths == false) && (bVar7 = QPDFObjectHandle::isStream(object), bVar7)) {
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->qdf_mode == true) && (peVar2->added_newline == true)) {
      ::qpdf::pl::Count::write(peVar2->pipeline,0x27db4c,(void *)0x15,uVar19);
    }
    openObject(this,objid + 1);
    __val = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            cur_stream_length;
    cVar17 = '\x01';
    if (9 < __val) {
      uVar19 = __val;
      cVar6 = '\x04';
      do {
        cVar17 = cVar6;
        if (uVar19 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_001f1117;
        }
        if (uVar19 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_001f1117;
        }
        if (uVar19 < 10000) goto LAB_001f1117;
        uVar16 = uVar19 / 10000;
        bVar7 = 99999 < uVar19;
        uVar19 = uVar16;
        cVar6 = cVar17 + '\x04';
      } while (bVar7);
      cVar17 = cVar17 + '\x01';
    }
LAB_001f1117:
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e0,(uint)local_d8,__val);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_e0,local_d8,uVar19);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    closeObject(this,objid + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObject(QPDFObjectHandle object, int object_stream_index)
{
    QPDFObjGen old_og = object.getObjGen();

    if ((object_stream_index == -1) && (old_og.getGen() == 0) &&
        (m->object_stream_to_objects.count(old_og.getObj()))) {
        writeObjectStream(object);
        return;
    }

    indicateProgress(false, false);
    auto new_id = m->obj[old_og].renumber;
    if (m->qdf_mode) {
        if (m->page_object_to_seq.count(old_og)) {
            writeString("%% Page ");
            writeString(std::to_string(m->page_object_to_seq[old_og]));
            writeString("\n");
        }
        if (m->contents_to_page_seq.count(old_og)) {
            writeString("%% Contents for page ");
            writeString(std::to_string(m->contents_to_page_seq[old_og]));
            writeString("\n");
        }
    }
    if (object_stream_index == -1) {
        if (m->qdf_mode && (!m->suppress_original_object_ids)) {
            writeString("%% Original object ID: " + object.getObjGen().unparse(' ') + "\n");
        }
        openObject(new_id);
        setDataKey(new_id);
        unparseObject(object, 0, 0);
        m->cur_data_key.clear();
        closeObject(new_id);
    } else {
        unparseObject(object, 0, f_in_ostream);
        writeString("\n");
    }

    if ((!m->direct_stream_lengths) && object.isStream()) {
        if (m->qdf_mode) {
            if (m->added_newline) {
                writeString("%QDF: ignore_newline\n");
            }
        }
        openObject(new_id + 1);
        writeString(std::to_string(m->cur_stream_length));
        closeObject(new_id + 1);
    }
}